

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SliceStaticLayerParams::SerializeWithCachedSizes
          (SliceStaticLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  int64 iVar2;
  RepeatedField<bool> *pRVar3;
  bool *pbVar4;
  int local_30;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SliceStaticLayerParams *this_local;
  
  iVar1 = beginids_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_beginids_cached_byte_size_)
    ;
  }
  i_1 = 0;
  iVar1 = beginids_size(this);
  for (; i_1 < iVar1; i_1 = i_1 + 1) {
    iVar2 = beginids(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteInt64NoTag(iVar2,output);
  }
  iVar1 = beginmasks_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_beginmasks_cached_byte_size_);
    pRVar3 = beginmasks(this);
    pbVar4 = google::protobuf::RepeatedField<bool>::data(pRVar3);
    iVar1 = beginmasks_size(this);
    google::protobuf::internal::WireFormatLite::WriteBoolArray(pbVar4,iVar1,output);
  }
  iVar1 = endids_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(3,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_endids_cached_byte_size_);
  }
  i_2 = 0;
  iVar1 = endids_size(this);
  for (; i_2 < iVar1; i_2 = i_2 + 1) {
    iVar2 = endids(this,i_2);
    google::protobuf::internal::WireFormatLite::WriteInt64NoTag(iVar2,output);
  }
  iVar1 = endmasks_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(4,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_endmasks_cached_byte_size_)
    ;
    pRVar3 = endmasks(this);
    pbVar4 = google::protobuf::RepeatedField<bool>::data(pRVar3);
    iVar1 = endmasks_size(this);
    google::protobuf::internal::WireFormatLite::WriteBoolArray(pbVar4,iVar1,output);
  }
  iVar1 = strides_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(5,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_strides_cached_byte_size_);
  }
  local_30 = 0;
  iVar1 = strides_size(this);
  for (; local_30 < iVar1; local_30 = local_30 + 1) {
    iVar2 = strides(this,local_30);
    google::protobuf::internal::WireFormatLite::WriteInt64NoTag(iVar2,output);
  }
  iVar1 = squeezemasks_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(6,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_squeezemasks_cached_byte_size_);
    pRVar3 = squeezemasks(this);
    pbVar4 = google::protobuf::RepeatedField<bool>::data(pRVar3);
    iVar1 = squeezemasks_size(this);
    google::protobuf::internal::WireFormatLite::WriteBoolArray(pbVar4,iVar1,output);
  }
  return;
}

Assistant:

void SliceStaticLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SliceStaticLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 beginIds = 1;
  if (this->beginids_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_beginids_cached_byte_size_);
  }
  for (int i = 0, n = this->beginids_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->beginids(i), output);
  }

  // repeated bool beginMasks = 2;
  if (this->beginmasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_beginmasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->beginmasks().data(), this->beginmasks_size(), output);
  }

  // repeated int64 endIds = 3;
  if (this->endids_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_endids_cached_byte_size_);
  }
  for (int i = 0, n = this->endids_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->endids(i), output);
  }

  // repeated bool endMasks = 4;
  if (this->endmasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(4, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_endmasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->endmasks().data(), this->endmasks_size(), output);
  }

  // repeated int64 strides = 5;
  if (this->strides_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(5, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_strides_cached_byte_size_);
  }
  for (int i = 0, n = this->strides_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->strides(i), output);
  }

  // repeated bool squeezeMasks = 6;
  if (this->squeezemasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(6, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_squeezemasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->squeezemasks().data(), this->squeezemasks_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SliceStaticLayerParams)
}